

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffpdfl(fitsfile *fptr,int *status)

{
  int err_mode;
  long bytepos;
  int *in_RSI;
  int *in_RDI;
  int ii;
  int tstatus;
  int nfill;
  LONGLONG fillstart;
  char fill [2880];
  char chfill;
  undefined4 in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  int iVar1;
  fitsfile *in_stack_fffffffffffff498;
  int *in_stack_fffffffffffff4c0;
  void *in_stack_fffffffffffff4c8;
  int *in_stack_fffffffffffff4d0;
  fitsfile *in_stack_fffffffffffff4d8;
  LONGLONG in_stack_fffffffffffff4e0;
  fitsfile *in_stack_fffffffffffff4e8;
  byte local_19;
  int local_4;
  
  if (*in_RSI < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if (*(long *)(*(long *)(in_RDI + 2) + 0x3d8) == 0) {
        local_4 = *in_RSI;
      }
      else {
        bytepos = *(long *)(*(long *)(in_RDI + 2) + 0x88) + *(long *)(*(long *)(in_RDI + 2) + 0x3d8)
                  + *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
        err_mode = (int)((bytepos + 0xb3f) / 0xb40) * 0xb40 - (int)bytepos;
        if (err_mode < 0xb40) {
          if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
            local_19 = 0x20;
          }
          else {
            local_19 = 0;
          }
          if (err_mode == 0) {
            ffmbyt(in_stack_fffffffffffff498,bytepos + -1,1,
                   (int *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
            ffgbyt(in_stack_fffffffffffff4d8,(LONGLONG)in_stack_fffffffffffff4d0,
                   in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
            local_4 = *in_RSI;
          }
          else {
            ffmbyt(in_stack_fffffffffffff498,bytepos,err_mode,
                   (int *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
            ffgbyt(in_stack_fffffffffffff4d8,(LONGLONG)in_stack_fffffffffffff4d0,
                   in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
            for (iVar1 = 0; (iVar1 < err_mode && ((&stack0xfffffffffffff498)[iVar1] == local_19));
                iVar1 = iVar1 + 1) {
            }
            if (iVar1 == err_mode) {
              local_4 = *in_RSI;
            }
            else {
              memset(&stack0xfffffffffffff498,(uint)local_19,(long)err_mode);
              ffmbyt(in_stack_fffffffffffff498,bytepos,err_mode,
                     (int *)CONCAT44(iVar1,in_stack_fffffffffffff480));
              ffpbyt(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                     in_stack_fffffffffffff4d0);
              if (0 < *in_RSI) {
                ffpmsg((char *)0x17a972);
              }
              local_4 = *in_RSI;
            }
          }
        }
        else {
          *in_RSI = 0x108;
          local_4 = *in_RSI;
        }
      }
    }
    else {
      local_4 = *in_RSI;
    }
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int ffpdfl(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Write the Data Unit Fill values if they are not already correct.
  The fill values are used to fill out the last 2880 byte block of the HDU.
  Fill the data unit with zeros or blanks depending on the type of HDU
  from the end of the data to the end of the current FITS 2880 byte block
*/
{
    char chfill, fill[2880];
    LONGLONG fillstart;
    int nfill, tstatus, ii;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        return(*status);      /* fill has already been correctly written */

    if ((fptr->Fptr)->heapstart == 0)
        return(*status);      /* null data unit, so there is no fill */

    fillstart = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart +
                (fptr->Fptr)->heapsize;

    nfill = (long) ((fillstart + 2879) / 2880 * 2880 - fillstart);
    if (nfill >= 2880) /* can only happen if fillstart was negative */
    {
        *status = BAD_HEAP_PTR;
        return (*status);
    }
    
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
        chfill = 32;         /* ASCII tables are filled with spaces */
    else
        chfill = 0;          /* all other extensions are filled with zeros */

    tstatus = 0;

    if (!nfill)  /* no fill bytes; just check that entire table exists */
    {
        fillstart--;
        nfill = 1;
        ffmbyt(fptr, fillstart, REPORT_EOF, &tstatus); /* move to last byte */
        ffgbyt(fptr, nfill, fill, &tstatus);           /* get the last byte */

        if (tstatus == 0)
            return(*status);  /* no EOF error, so everything is OK */
    }
    else
    {
        ffmbyt(fptr, fillstart, REPORT_EOF, &tstatus); /* move to fill area */
        ffgbyt(fptr, nfill, fill, &tstatus);           /* get the fill bytes */

        if (tstatus == 0)
        {
            for (ii = 0; ii < nfill; ii++)
            {
                if (fill[ii] != chfill)
                    break;
            }

            if (ii == nfill)
                return(*status);   /* all the fill values were correct */
        }
    }

    /* fill values are incorrect or have not been written, so write them */

    memset(fill, chfill, nfill);  /* fill the buffer with the fill value */

    ffmbyt(fptr, fillstart, IGNORE_EOF, status); /* move to fill area */
    ffpbyt(fptr, nfill, fill, status); /* write the fill bytes */

    if (*status > 0)
        ffpmsg("Error writing Data Unit fill bytes (ffpdfl).");

    return(*status);
}